

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::CommandLineInterface::MemoryOutputStream::MemoryOutputStream
          (MemoryOutputStream *this,GeneratorContextImpl *directory,string *filename,
          string *insertion_point)

{
  StringOutputStream *this_00;
  string *insertion_point_local;
  string *filename_local;
  GeneratorContextImpl *directory_local;
  MemoryOutputStream *this_local;
  
  io::ZeroCopyOutputStream::ZeroCopyOutputStream(&this->super_ZeroCopyOutputStream);
  (this->super_ZeroCopyOutputStream)._vptr_ZeroCopyOutputStream =
       (_func_int **)&PTR__MemoryOutputStream_0040ea98;
  this->directory_ = directory;
  std::__cxx11::string::string((string *)&this->filename_,(string *)filename);
  std::__cxx11::string::string((string *)&this->insertion_point_,(string *)insertion_point);
  std::__cxx11::string::string((string *)&this->data_);
  this_00 = (StringOutputStream *)operator_new(0x10);
  io::StringOutputStream::StringOutputStream(this_00,&this->data_);
  internal::scoped_ptr<google::protobuf::io::StringOutputStream>::scoped_ptr(&this->inner_,this_00);
  return;
}

Assistant:

CommandLineInterface::MemoryOutputStream::MemoryOutputStream(
    GeneratorContextImpl* directory, const string& filename,
    const string& insertion_point)
    : directory_(directory),
      filename_(filename),
      insertion_point_(insertion_point),
      inner_(new io::StringOutputStream(&data_)) {
}